

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callable.hpp
# Opt level: O0

bool __thiscall
psst::meta::
or_<afsm::actions::detail::guard_check<afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,vending::vending_def::on::maintenance,vending::events::end_maintenance,vending::vending_def::is_empty>,afsm::actions::detail::guard_check<afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,vending::vending_def::on::maintenance,vending::events::end_maintenance,vending::vending_def::prices_correct>>
::operator()(or_<afsm::actions::detail::guard_check<afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,vending::vending_def::on::maintenance,vending::events::end_maintenance,vending::vending_def::is_empty>,afsm::actions::detail::guard_check<afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,vending::vending_def::on::maintenance,vending::events::end_maintenance,vending::vending_def::prices_correct>>
             *this,inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
                   *args,maintenance *args_1,end_maintenance *args_2)

{
  bool bVar1;
  bool local_2b;
  and_<afsm::actions::detail::guard_check<afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,vending::vending_def::on::maintenance,vending::events::end_maintenance,vending::vending_def::prices_correct>>
  local_2a;
  guard_event_check<false,_afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_vending::vending_def::on::maintenance,_vending::events::end_maintenance,_vending::vending_def::is_empty>
  local_29;
  end_maintenance *local_28;
  end_maintenance *args_local_2;
  maintenance *args_local_1;
  inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
  *args_local;
  or_<afsm::actions::detail::guard_check<afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_vending::vending_def::on::maintenance,_vending::events::end_maintenance,_vending::vending_def::is_empty>,_afsm::actions::detail::guard_check<afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_vending::vending_def::on::maintenance,_vending::events::end_maintenance,_vending::vending_def::prices_correct>_>
  *this_local;
  
  local_28 = args_2;
  args_local_2 = (end_maintenance *)args_1;
  args_local_1 = (maintenance *)args;
  args_local = (inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
                *)this;
  bVar1 = afsm::actions::detail::
          guard_event_check<false,_afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_vending::vending_def::on::maintenance,_vending::events::end_maintenance,_vending::vending_def::is_empty>
          ::operator()(&local_29,args,args_1,args_2);
  local_2b = true;
  if (!bVar1) {
    local_2b = and_<afsm::actions::detail::guard_check<afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,vending::vending_def::on::maintenance,vending::events::end_maintenance,vending::vending_def::prices_correct>>
               ::operator()(&local_2a,
                            (inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
                             *)args_local_1,(maintenance *)args_local_2,local_28);
  }
  return local_2b;
}

Assistant:

bool
    operator()(Args&& ... args) const
    {
        return Predicate{}(::std::forward<Args>(args)...)
            || and_<Rest...>{}(::std::forward<Args>(args)...);
    }